

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O2

bool __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::removeObject
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this,
          function<bool_(const_std::shared_ptr<helics::Core>_&)> *operand)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  iterator __position;
  iterator __position_00;
  
  std::mutex::lock(&this->mapLock);
  __position._M_node =
       (_Base_ptr)(this->objectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->objectMap)._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
LAB_00241b7d:
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return (_Rb_tree_header *)__position._M_node != p_Var1;
    }
    bVar2 = std::function<bool_(const_std::shared_ptr<helics::Core>_&)>::operator()
                      (operand,(shared_ptr<helics::Core> *)(__position._M_node + 2));
    if (bVar2) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>>
                          *)&this->objectMap,__position);
      __position_00 =
           std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
           ::find(&(this->typeMap)._M_t,__position._M_node + 1);
      if ((_Rb_tree_header *)__position_00._M_node !=
          &(this->typeMap)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
                            *)&this->typeMap,__position_00);
      }
      goto LAB_00241b7d;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

bool removeObject(std::function<bool(const std::shared_ptr<X>&)> operand)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        for (auto obj = objectMap.begin(); obj != objectMap.end(); ++obj) {
            if (operand(obj->second)) {
                objectMap.erase(obj);
                auto fnd2 = typeMap.find(obj->first);
                if (fnd2 != typeMap.end()) {
                    typeMap.erase(fnd2);
                }
                return true;
            }
        }
        return false;
    }